

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::copy_from(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
            *this,flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                  *other)

{
  char *from_buffer;
  pointer_type pcVar1;
  buffer_type *pbVar2;
  size_with_padding<8UL> sVar3;
  char *pcVar4;
  size_t sVar5;
  undefined1 local_38 [8];
  sizes_t other_sizes;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  *other_local;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  *this_local;
  
  other_sizes.last_element.super_range.buffer_end = (size_t)other;
  clear(this);
  pbVar2 = buff((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                 *)other_sizes.last_element.super_range.buffer_end);
  if (pbVar2->last != (pointer_type)0x0) {
    get_all_sizes((sizes_t *)local_38,
                  (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                   *)other_sizes.last_element.super_range.buffer_end);
    sVar3 = flat_forward_list_sizes<8UL>::used_capacity((flat_forward_list_sizes<8UL> *)local_38);
    pcVar4 = allocate_buffer(this,sVar3.size);
    pbVar2 = buff(this);
    pbVar2->begin = pcVar4;
    pbVar2 = buff(this);
    pcVar4 = pbVar2->begin;
    pbVar2 = buff((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                   *)other_sizes.last_element.super_range.buffer_end);
    from_buffer = pbVar2->begin;
    sVar3 = flat_forward_list_sizes<8UL>::used_capacity((flat_forward_list_sizes<8UL> *)local_38);
    copy_data(pcVar4,from_buffer,sVar3.size);
    pbVar2 = buff(this);
    pcVar1 = pbVar2->begin;
    sVar3 = flat_forward_list_sizes<8UL>::used_capacity((flat_forward_list_sizes<8UL> *)local_38);
    pbVar2 = buff(this);
    pbVar2->end = pcVar1 + sVar3.size;
    pbVar2 = buff(this);
    pcVar1 = pbVar2->begin;
    sVar5 = iffl::range::begin((range *)&other_sizes);
    pbVar2 = buff(this);
    pbVar2->last = pcVar1 + sVar5;
  }
  return;
}

Assistant:

void copy_from(flat_forward_list const &other) {
        clear();
        if (other.buff().last) {
            sizes_t const other_sizes{ other.get_all_sizes() };
            buff().begin = allocate_buffer(other_sizes.used_capacity().size);
            copy_data(buff().begin, other.buff().begin, other_sizes.used_capacity().size);
            buff().end = buff().begin + other_sizes.used_capacity().size;
            buff().last = buff().begin + other_sizes.last_element.begin();
        }
    }